

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

void rlib::operator<<(std::ostream&,rlib::JsonT<void>::Stringify_const&)::F::f(std::ostream&,rlib::
     JsonT<void>const&,rlib::JsonT<void>::Stringify::Format_const&,std::__cxx11::string_const__
               (ostream *os,JsonT<void> *j,Format *f,string *depth)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  char *pcVar3;
  JsonT<void> *j_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  _Rb_tree_node_base *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  switch(j->m_type) {
  case Null:
    std::operator<<(os,"null");
    return;
  case Bool:
    *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) =
         *(uint *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) | 1;
    std::ostream::_M_insert<bool>(SUB81(os,0));
    return;
  case Float:
    std::ostream::_M_insert<double>((j->field_1).m_float);
    return;
  case Int:
    std::ostream::_M_insert<long>((long)os);
    return;
  case String:
    escape(std::__cxx11::string_const__(&local_70,&(j->field_1).m_string);
    std::operator+(&local_90,"\"",&local_70);
    std::operator+(&local_c0,&local_90,"\"");
    std::operator<<(os,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    return;
  case Array:
    poVar1 = std::operator<<(os,"[");
    std::operator<<(poVar1,(string *)f);
    for (j_00 = (JsonT<void> *)(j->field_1).m_int;
        j_00 != (JsonT<void> *)(j->field_1).m_string._M_string_length; j_00 = j_00 + 1) {
      if (j_00 != (JsonT<void> *)(j->field_1).m_int) {
        poVar1 = std::operator<<(os,",");
        std::operator<<(poVar1,(string *)f);
      }
      poVar1 = std::operator<<(os,(string *)depth);
      std::operator<<(poVar1,(string *)&f->indent);
      std::operator+(&local_c0,depth,&f->indent);
      string_const__(os,j_00,f,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    poVar1 = std::operator<<(os,(string *)f);
    poVar1 = std::operator<<(poVar1,(string *)depth);
    pcVar3 = "]";
    break;
  case Map:
    poVar1 = std::operator<<(os,"{");
    std::operator<<(poVar1,(string *)f);
    local_98 = (_Rb_tree_node_base *)((long)&j->field_1 + 8);
    local_a0 = &f->colon;
    for (p_Var2 = *(_Rb_tree_node_base **)((long)&j->field_1 + 0x18); p_Var2 != local_98;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (p_Var2 != *(_Rb_tree_node_base **)((long)&j->field_1 + 0x18)) {
        poVar1 = std::operator<<(os,",");
        std::operator<<(poVar1,(string *)f);
      }
      poVar1 = std::operator<<(os,(string *)depth);
      std::operator<<(poVar1,(string *)&f->indent);
      escape(std::__cxx11::string_const__(&local_50,(string *)(p_Var2 + 1));
      std::operator+(&local_70,"\"",&local_50);
      std::operator+(&local_90,&local_70,"\"");
      std::operator+(&local_c0,&local_90,local_a0);
      std::operator<<(os,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator+(&local_c0,depth,&f->indent);
      string_const__(os,(JsonT<void> *)(p_Var2 + 2),f,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    poVar1 = std::operator<<(os,(string *)f);
    poVar1 = std::operator<<(poVar1,(string *)depth);
    pcVar3 = "}";
    break;
  default:
    goto switchD_00128282_default;
  }
  std::operator<<(poVar1,pcVar3);
switchD_00128282_default:
  return;
}

Assistant:

static void f(std::ostream& os, const JsonT& j, const typename Stringify::Format& f, const std::string& depth) {
					switch (j.type()) {
					case Type::Null:
						os << "null";
						break;
					case Type::Bool:
						os << std::boolalpha << j.m_bool;
						break;
					case Type::Float:
						os << j.m_float;
						break;
					case Type::Int:
						os << j.m_int;
						break;
					case Type::String:
						os << "\"" + escape(j.m_string) + "\"";
						break;
					case Type::Array:
						os << "[" << f.lf;
						for (auto it = j.m_array.cbegin(); it != j.m_array.cend(); it++) {
							if (it != j.m_array.cbegin()) os << "," << f.lf;
							os << depth << f.indent;
							F::f(os, *it, f, depth + f.indent);
						}
						os << f.lf << depth << "]";
						break;
					case Type::Map:
						os << "{" << f.lf;
						for (auto it = j.m_map.cbegin(); it != j.m_map.cend(); it++) {
							if (it != j.m_map.cbegin()) os << "," << f.lf;
							os << depth << f.indent;
							os << "\"" + escape(it->first) + "\"" + f.colon;
							F::f(os, it->second, f, depth + f.indent);
						}
						os << f.lf << depth << "}";
						break;
					default:
						assert(false);
					}
				}